

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::run_until_stable(Simulator *this,size_t stable_ticks)

{
  size_t sVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  bool bVar3;
  size_t sStack_28;
  bool stable;
  size_t remaining;
  bool stop;
  size_t stable_ticks_local;
  Simulator *this_local;
  
  bVar3 = false;
  sVar1 = stable_ticks;
  while (sStack_28 = sVar1, !bVar3) {
    step(this);
    __first = std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        (&this->m_node_change_time);
    __last = std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->m_node_change_time);
    bVar2 = std::
            none_of<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,lsim::Simulator::run_until_stable(unsigned_long)::__0>
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )__first._M_current,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )__last._M_current,(anon_class_8_1_8991fb9c_for__M_pred)this);
    sVar1 = stable_ticks;
    if (bVar2) {
      bVar3 = sStack_28 - 1 == 0;
      sVar1 = sStack_28 - 1;
    }
  }
  return;
}

Assistant:

void Simulator::run_until_stable(size_t stable_ticks) {
    bool stop = false;
    auto remaining = stable_ticks;

    while (!stop) {
        step();

        bool stable = std::none_of(std::begin(m_node_change_time), std::end(m_node_change_time), 
                            [=] (auto t) {return t == m_time;}
        );

        if (!stable) {
            remaining = stable_ticks;
        } else {
            stop = --remaining == 0;
        }
    }
}